

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void convergeephemerons(global_State *g)

{
  Table *pTVar1;
  bool bVar2;
  int iVar3;
  Table *h;
  
  do {
    h = (Table *)g->ephemeron;
    g->ephemeron = (GCObject *)0x0;
    if (h == (Table *)0x0) {
      return;
    }
    bVar2 = false;
    do {
      pTVar1 = (Table *)h->gclist;
      iVar3 = traverseephemeron(g,h);
      if (iVar3 != 0) {
        bVar2 = true;
        while (g->gray != (GCObject *)0x0) {
          propagatemark(g);
        }
      }
      h = pTVar1;
    } while (pTVar1 != (Table *)0x0);
  } while (bVar2);
  return;
}

Assistant:

static void convergeephemerons(global_State *g) {
    int changed;
    do {
        GCObject *w;
        GCObject *next = g->ephemeron;  /* get ephemeron list */
        g->ephemeron = NULL;  /* tables may return to this list when traversed */
        changed = 0;
        while ((w = next) != NULL) {
            next = gco2t(w)->gclist;
            if (traverseephemeron(g, gco2t(w))) {  /* traverse marked some value? */
                propagateall(g);  /* propagate changes */
                changed = 1;  /* will have to revisit all ephemeron tables */
            }
        }
    } while (changed);
}